

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TCPServer.cpp
# Opt level: O3

void __thiscall SocketPP::TCPServer::~TCPServer(TCPServer *this)

{
  thread *ptVar1;
  _Manager_type p_Var2;
  pointer pTVar3;
  
  (this->super_SocketServer).super_Socket._vptr_Socket = (_func_int **)&PTR_onConnected_0010acd0;
  (this->super_SocketServer).super_Socket.field_0xd = 1;
  std::condition_variable::notify_one();
  std::thread::join();
  ptVar1 = this->sendThread_;
  if ((ptVar1 != (thread *)0x0) && ((ptVar1->_M_id)._M_thread != 0)) {
    std::terminate();
  }
  operator_delete(ptVar1);
  p_Var2 = (this->discHandle_).super__Function_base._M_manager;
  if (p_Var2 != (_Manager_type)0x0) {
    (*p_Var2)((_Any_data *)&this->discHandle_,(_Any_data *)&this->discHandle_,__destroy_functor);
  }
  p_Var2 = (this->connHandle_).super__Function_base._M_manager;
  if (p_Var2 != (_Manager_type)0x0) {
    (*p_Var2)((_Any_data *)&this->connHandle_,(_Any_data *)&this->connHandle_,__destroy_functor);
  }
  p_Var2 = (this->recvHandle_).super__Function_base._M_manager;
  if (p_Var2 != (_Manager_type)0x0) {
    (*p_Var2)((_Any_data *)&this->recvHandle_,(_Any_data *)&this->recvHandle_,__destroy_functor);
  }
  p_Var2 = (this->sendHandle_).super__Function_base._M_manager;
  if (p_Var2 != (_Manager_type)0x0) {
    (*p_Var2)((_Any_data *)&this->sendHandle_,(_Any_data *)&this->sendHandle_,__destroy_functor);
  }
  p_Var2 = (this->sendInterceptor_).super__Function_base._M_manager;
  if (p_Var2 != (_Manager_type)0x0) {
    (*p_Var2)((_Any_data *)&this->sendInterceptor_,(_Any_data *)&this->sendInterceptor_,
              __destroy_functor);
  }
  std::condition_variable::~condition_variable(&this->msgQueueCondition_);
  std::deque<SocketPP::Message,_std::allocator<SocketPP::Message>_>::~deque(&(this->msgQueue_).c);
  pTVar3 = (this->connectedStreams_).
           super__Vector_base<SocketPP::TCPStream,_std::allocator<SocketPP::TCPStream>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (pTVar3 != (pointer)0x0) {
    operator_delete(pTVar3);
  }
  Socket::~Socket((Socket *)this);
  return;
}

Assistant:

TCPServer::~TCPServer() {
    stopped_ = true;
    msgQueueCondition_.notify_one();
    sendThread_->join();
    delete sendThread_;
}